

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

bool dirichlet_mix_check(int comp_num,int elem_num,double *a,double *comp_weight)

{
  bool bVar1;
  ostream *poVar2;
  int local_30;
  int iStack_2c;
  bool positive;
  int elem_i;
  int comp_i;
  double *comp_weight_local;
  double *a_local;
  int elem_num_local;
  int comp_num_local;
  
  for (iStack_2c = 0; iStack_2c < comp_num; iStack_2c = iStack_2c + 1) {
    for (local_30 = 0; local_30 < elem_num; local_30 = local_30 + 1) {
      if (a[local_30 + iStack_2c * elem_num] <= 0.0) {
        std::operator<<((ostream *)&std::cerr," \n");
        std::operator<<((ostream *)&std::cerr,"DIRICHLET_MIX_CHECK - Warning!\n");
        std::operator<<((ostream *)&std::cerr,"  A(ELEM,COMP) <= 0.\n");
        poVar2 = std::operator<<((ostream *)&std::cerr,"  COMP = ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,iStack_2c);
        std::operator<<(poVar2,"\n");
        poVar2 = std::operator<<((ostream *)&std::cerr,"  ELEM = ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_30);
        std::operator<<(poVar2,"\n");
        poVar2 = std::operator<<((ostream *)&std::cerr,"  A(COMP,ELEM) = ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,a[local_30 + iStack_2c * elem_num]);
        std::operator<<(poVar2,"\n");
        return false;
      }
    }
  }
  bVar1 = false;
  iStack_2c = 0;
  while( true ) {
    if (comp_num <= iStack_2c) {
      if (!bVar1) {
        std::operator<<((ostream *)&std::cerr," \n");
        std::operator<<((ostream *)&std::cerr,"DIRICHLET_MIX_CHECK - Warning!\n");
        std::operator<<((ostream *)&std::cerr,"  All component weights are zero.\n");
      }
      return bVar1;
    }
    if (comp_weight[iStack_2c] <= 0.0 && comp_weight[iStack_2c] != 0.0) break;
    if (0.0 < comp_weight[iStack_2c]) {
      bVar1 = true;
    }
    iStack_2c = iStack_2c + 1;
  }
  std::operator<<((ostream *)&std::cerr," \n");
  std::operator<<((ostream *)&std::cerr,"DIRICHLET_MIX_CHECK - Warning!\n");
  std::operator<<((ostream *)&std::cerr,"  COMP_WEIGHT(COMP) < 0.\n");
  poVar2 = std::operator<<((ostream *)&std::cerr,"  COMP = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iStack_2c);
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<((ostream *)&std::cerr,"  COMP_WEIGHT(COMP) = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,comp_weight[iStack_2c]);
  std::operator<<(poVar2,"\n");
  return false;
}

Assistant:

bool dirichlet_mix_check ( int comp_num, int elem_num, double a[],
  double comp_weight[] )

//****************************************************************************80
//
//  Purpose:
//
//    DIRICHLET_MIX_CHECK checks the parameters of a Dirichlet mixture PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    30 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int COMP_NUM, the number of components in the Dirichlet
//    mixture density, that is, the number of distinct Dirichlet PDF's
//    that are mixed together.
//
//    Input, int ELEM_NUM, the number of elements of an observation.
//
//    Input, double A[ELEM_NUM*COMP_NUM], the probabilities
//    for element ELEM_NUM in component COMP_NUM.
//    Each A[I,J] should be positive.
//
//    Input, double COMP_WEIGHT[COMP_NUM], the mixture weights of the densities.
//    These do not need to be normalized.  The weight of a given component is
//    the relative probability that that component will be used to generate
//    the sample.
//
//    Output, bool DIRICHLET_MIX_CHECK, is true if the parameters are legal.
//
{
  int comp_i;
  int elem_i;
  bool positive;

  for ( comp_i = 0; comp_i < comp_num; comp_i++ )
  {
    for ( elem_i = 0; elem_i < elem_num; elem_i++ )
    {
      if ( a[elem_i+comp_i*elem_num] <= 0.0 )
      {
        cerr << " \n";
        cerr << "DIRICHLET_MIX_CHECK - Warning!\n";
        cerr << "  A(ELEM,COMP) <= 0.\n";
        cerr << "  COMP = " << comp_i << "\n";
        cerr << "  ELEM = " << elem_i << "\n";
        cerr << "  A(COMP,ELEM) = " << a[elem_i+comp_i*elem_num] << "\n";
        return false;
      }
    }
  }

  positive = false;

  for ( comp_i = 0; comp_i < comp_num; comp_i++ )
  {
    if ( comp_weight[comp_i] < 0.0 )
    {
      cerr << " \n";
      cerr << "DIRICHLET_MIX_CHECK - Warning!\n";
      cerr << "  COMP_WEIGHT(COMP) < 0.\n";
      cerr << "  COMP = " << comp_i << "\n";
      cerr << "  COMP_WEIGHT(COMP) = " << comp_weight[comp_i] << "\n";
      return false;
    }
    else if ( 0.0 < comp_weight[comp_i] )
    {
      positive = true;
    }
  }

  if ( !positive )
  {
    cerr << " \n";
    cerr << "DIRICHLET_MIX_CHECK - Warning!\n";
    cerr << "  All component weights are zero.\n";
    return false;
  }

  return true;
}